

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O0

pair<llvm::NoneType,_bool> __thiscall
llvm::SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::insert
          (SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *this,uint *V)

{
  bool bVar1;
  pair<llvm::NoneType,_bool> pVar2;
  VIterator puVar3;
  iterator puVar4;
  size_t sVar5;
  reference __x;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar6;
  bool local_71;
  _Base_ptr local_70;
  undefined1 local_68;
  _Base_ptr local_60;
  undefined1 local_58;
  bool local_4a;
  bool local_49;
  VIterator local_48;
  VIterator I;
  undefined1 local_38;
  _Base_ptr local_30;
  bool local_28 [8];
  value_type_conflict2 *local_20;
  uint *V_local;
  SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *this_local;
  
  local_20 = V;
  V_local = (uint *)this;
  bVar1 = isSmall(this);
  if (bVar1) {
    puVar3 = vfind(this,local_20);
    local_48 = puVar3;
    puVar4 = SmallVectorTemplateCommon<unsigned_int,_void>::end
                       ((SmallVectorTemplateCommon<unsigned_int,_void> *)this);
    if (puVar3 == puVar4) {
      sVar5 = SmallVectorBase::size((SmallVectorBase *)this);
      if (sVar5 < 5) {
        SmallVectorTemplateBase<unsigned_int,_true>::push_back
                  ((SmallVectorTemplateBase<unsigned_int,_true> *)this,local_20);
        local_4a = true;
        pVar2 = std::make_pair<llvm::NoneType_const&,bool>(&None,&local_4a);
        this_local._0_4_ = pVar2.first;
        this_local._4_4_ = CONCAT31(this_local._5_3_,pVar2.second);
      }
      else {
        while (bVar1 = SmallVectorBase::empty((SmallVectorBase *)this), ((bVar1 ^ 0xffU) & 1) != 0)
        {
          __x = SmallVectorTemplateCommon<unsigned_int,_void>::back
                          ((SmallVectorTemplateCommon<unsigned_int,_void> *)this);
          pVar6 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  insert(&this->Set,__x);
          local_60 = (_Base_ptr)pVar6.first._M_node;
          local_58 = pVar6.second;
          SmallVectorTemplateBase<unsigned_int,_true>::pop_back
                    ((SmallVectorTemplateBase<unsigned_int,_true> *)this);
        }
        pVar6 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                insert(&this->Set,local_20);
        local_70 = (_Base_ptr)pVar6.first._M_node;
        local_68 = pVar6.second;
        local_71 = true;
        pVar2 = std::make_pair<llvm::NoneType_const&,bool>(&None,&local_71);
        this_local._0_4_ = pVar2.first;
        this_local._4_4_ = CONCAT31(this_local._5_3_,pVar2.second);
      }
    }
    else {
      local_49 = false;
      pVar2 = std::make_pair<llvm::NoneType_const&,bool>(&None,&local_49);
      this_local._0_4_ = pVar2.first;
      this_local._4_4_ = CONCAT31(this_local._5_3_,pVar2.second);
    }
  }
  else {
    pVar6 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                      (&this->Set,local_20);
    I = (VIterator)pVar6.first._M_node;
    local_38 = pVar6.second;
    local_30 = (_Base_ptr)I;
    local_28[0] = (bool)local_38;
    pVar2 = std::make_pair<llvm::NoneType_const&,bool>(&None,local_28);
    this_local._0_4_ = pVar2.first;
    this_local._4_4_ = CONCAT31(this_local._5_3_,pVar2.second);
  }
  pVar2._4_4_ = this_local._4_4_;
  pVar2.first = (NoneType)this_local;
  return pVar2;
}

Assistant:

std::pair<NoneType, bool> insert(const T &V) {
    if (!isSmall())
      return std::make_pair(None, Set.insert(V).second);

    VIterator I = vfind(V);
    if (I != Vector.end())    // Don't reinsert if it already exists.
      return std::make_pair(None, false);
    if (Vector.size() < N) {
      Vector.push_back(V);
      return std::make_pair(None, true);
    }

    // Otherwise, grow from vector to set.
    while (!Vector.empty()) {
      Set.insert(Vector.back());
      Vector.pop_back();
    }
    Set.insert(V);
    return std::make_pair(None, true);
  }